

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

void borg_init_flow_kill(void)

{
  monster_race *pmVar1;
  _Bool _Var2;
  monster_race *r_ptr;
  wchar_t i;
  
  borg_kills_cnt = 0;
  borg_kills_nxt = 1;
  borg_kills = (borg_kill *)mem_zalloc(0x1d800);
  borg_race_count = (int16_t *)mem_zalloc((ulong)z_info->r_max << 1);
  borg_race_death = (int16_t *)mem_zalloc((ulong)z_info->r_max << 1);
  for (r_ptr._4_4_ = 1; pmVar1 = r_info, r_ptr._4_4_ < (int)(z_info->r_max - 1);
      r_ptr._4_4_ = r_ptr._4_4_ + 1) {
    if (((r_info[r_ptr._4_4_].name != (char *)0x0) &&
        (_Var2 = flag_has_dbg(r_info[r_ptr._4_4_].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var2))
       && (pmVar1[r_ptr._4_4_].max_num == '\0')) {
      borg_race_death[r_ptr._4_4_] = 1;
    }
  }
  borg_init_monster_names();
  return;
}

Assistant:

void borg_init_flow_kill(void)
{
    /*** Monster tracking ***/

    /* No monsters yet */
    borg_kills_cnt = 0;
    borg_kills_nxt = 1;

    /* Array of monsters */
    borg_kills = mem_zalloc(256 * sizeof(borg_kill));

    /* Count racial appearances */
    borg_race_count = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /* Count racial deaths */
    borg_race_death = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /*** XXX XXX XXX Hack -- Cheat ***/

    /* Hack -- Extract dead uniques */
    for (int i = 1; i < z_info->r_max - 1; i++) {
        struct monster_race *r_ptr = &r_info[i];

        /* Skip non-monsters */
        if (!r_ptr->name)
            continue;

        /* Skip non-uniques */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            continue;

        /* Mega-Hack -- Access "dead unique" list */
        if (r_ptr->max_num == 0)
            borg_race_death[i] = 1;
    }

    borg_init_monster_names();
}